

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSMisc.h
# Opt level: O2

void quaternion2euler(double qw,double qx,double qy,double qz,double *pRoll,double *pPitch,
                     double *pYaw)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  dVar2 = qw + qw;
  dVar4 = qw * qw + qw * qw;
  dVar1 = atan2((qy + qy) * qz + dVar2 * qx,qz * qz + qz * qz + dVar4 + -1.0);
  *pRoll = dVar1;
  dVar3 = (qx + qx) * qz - dVar2 * qy;
  dVar1 = -1.0;
  if ((-1.0 <= dVar3) && (dVar1 = 1.0, dVar3 <= 1.0)) {
    dVar1 = dVar3;
  }
  dVar1 = asin(dVar1);
  *pPitch = -dVar1;
  dVar1 = atan2((qx + qx) * qy + dVar2 * qz,dVar4 + qx * qx + qx * qx + -1.0);
  *pYaw = dVar1;
  return;
}

Assistant:

inline void quaternion2euler(double qw, double qx, double qy, double qz, double* pRoll, double* pPitch, double* pYaw)
{
	*pRoll = atan2(2*qy*qz+2*qw*qx, 2*sqr(qw)+2*sqr(qz)-1);
	*pPitch = -asin(constrain(2*qx*qz-2*qw*qy, -1, 1)); // Attempt to avoid potential NAN...
	*pYaw = atan2(2*qx*qy+2*qw*qz, 2*sqr(qw)+2*sqr(qx)-1);
}